

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O0

void __thiscall
duckdb::DbpDecoder::GetBatch<int>(DbpDecoder *this,data_ptr_t target_values_ptr,idx_t batch_size)

{
  runtime_error *this_00;
  long in_RDX;
  long in_RDI;
  idx_t unaff_retaddr;
  data_ptr_t in_stack_00000008;
  DbpDecoder *in_stack_00000010;
  
  if (*(ulong *)(in_RDI + 0x28) < (ulong)(*(long *)(in_RDI + 0x40) + in_RDX)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"DBP decode did not find enough values");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  *(long *)(in_RDI + 0x40) = in_RDX + *(long *)(in_RDI + 0x40);
  GetBatchInternal<int,false>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void GetBatch(const data_ptr_t target_values_ptr, const idx_t batch_size) {
		if (read_values + batch_size > total_value_count) {
			throw std::runtime_error("DBP decode did not find enough values");
		}
		read_values += batch_size;
		GetBatchInternal<T>(target_values_ptr, batch_size);
	}